

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_mrihtol.c
# Opt level: O2

int SUNAdaptController_EstimateStepTol_MRIHTol
              (SUNAdaptController C,sunrealtype H,sunrealtype tolfac,int P,sunrealtype DSM,
              sunrealtype dsm,sunrealtype *Hnew,sunrealtype *tolfacnew)

{
  void *pvVar1;
  undefined4 in_register_00000034;
  double dVar2;
  double local_20;
  
  SUNAdaptController_EstimateStep(H,DSM,*C->content,CONCAT44(in_register_00000034,P));
  SUNAdaptController_EstimateStep(tolfac,dsm,*(undefined8 *)((long)C->content + 8),0,&local_20);
  pvVar1 = C->content;
  dVar2 = tolfac / *(double *)((long)pvVar1 + 0x10);
  if (local_20 <= dVar2) {
    local_20 = dVar2;
  }
  dVar2 = *(double *)((long)pvVar1 + 0x10) * tolfac;
  if (dVar2 <= local_20) {
    local_20 = dVar2;
  }
  if (local_20 <= *(double *)((long)pvVar1 + 0x18)) {
    local_20 = *(double *)((long)pvVar1 + 0x18);
  }
  if (*(double *)((long)pvVar1 + 0x20) <= local_20) {
    local_20 = *(double *)((long)pvVar1 + 0x20);
  }
  *tolfacnew = local_20;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_EstimateStepTol_MRIHTol(
  SUNAdaptController C, sunrealtype H, sunrealtype tolfac, int P,
  sunrealtype DSM, sunrealtype dsm, sunrealtype* Hnew, sunrealtype* tolfacnew)
{
  SUNFunctionBegin(C->sunctx);
  SUNAssert(Hnew, SUN_ERR_ARG_CORRUPT);
  SUNAssert(tolfacnew, SUN_ERR_ARG_CORRUPT);
  sunrealtype tolfacest;

  /* Call slow time scale sub-controller to fill Hnew -- note that all heuristics
     bounds on Hnew will be enforced by the time integrator itself */
  SUNCheckCall(SUNAdaptController_EstimateStep(MRIHTOL_CSLOW(C), H, P, DSM, Hnew));

  /* Call fast time scale sub-controller with order=1: no matter the integrator
     order, we expect its error to be proportional to the tolerance factor */
  SUNCheckCall(SUNAdaptController_EstimateStep(MRIHTOL_CFAST(C), tolfac, 0, dsm,
                                               &tolfacest));

  /* Enforce bounds on estimated tolerance factor */
  /*     keep relative change within bounds */
  tolfacest = SUNMAX(tolfacest, tolfac / MRIHTOL_INNER_MAX_RELCH(C));
  tolfacest = SUNMIN(tolfacest, tolfac * MRIHTOL_INNER_MAX_RELCH(C));
  /*     enforce absolute min/max bounds */
  tolfacest = SUNMAX(tolfacest, MRIHTOL_INNER_MIN_TOLFAC(C));
  tolfacest = SUNMIN(tolfacest, MRIHTOL_INNER_MAX_TOLFAC(C));

  /* Set result and return */
  *tolfacnew = tolfacest;
  return SUN_SUCCESS;
}